

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCraneRailAShapeProfileDef,_12UL>::
         Construct(DB *db,LIST *params)

{
  IfcParameterizedProfileDef *this;
  
  this = (IfcParameterizedProfileDef *)operator_new(0x108);
  *(undefined ***)&this[1].super_IfcProfileDef.field_0x68 = &PTR__Object_008f50b0;
  *(undefined8 *)&this[1].field_0x70 = 0;
  *(char **)&this[1].field_0x78 = "IfcCraneRailAShapeProfileDef";
  Assimp::IFC::Schema_2x3::IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (this,&PTR_construction_vtable_24__00916b28);
  *(undefined8 *)&this->field_0x78 = 0;
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcCraneRailAShapeProfileDef_00916a98;
  *(undefined ***)&this[1].super_IfcProfileDef.field_0x68 =
       &PTR__IfcCraneRailAShapeProfileDef_00916b10;
  *(undefined ***)&(this->super_IfcProfileDef).field_0x58 =
       &PTR__IfcCraneRailAShapeProfileDef_00916ac0;
  *(undefined ***)&this->field_0x70 = &PTR__IfcCraneRailAShapeProfileDef_00916ae8;
  this[1].super_IfcProfileDef.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  field_0x10 = 0;
  this[1].super_IfcProfileDef.field_0x60 = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcParameterizedProfileDef>(db,params,this);
  return (Object *)
         ((long)&(this->super_IfcProfileDef).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
         + (long)(this->super_IfcProfileDef).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
                 [-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }